

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::EnumDescriptorProto::SharedDtor(MessageLite *self)

{
  EnumOptions *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    this = (EnumOptions *)self[6]._internal_metadata_.ptr_;
    if (this != (EnumOptions *)0x0) {
      EnumOptions::~EnumOptions(this);
      operator_delete(this,0x58);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)
               (self + 3));
    RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
               &self[1]._internal_metadata_);
    return;
  }
  SharedDtor((EnumDescriptorProto *)&stack0xffffffffffffffe0);
}

Assistant:

inline void EnumDescriptorProto::SharedDtor(MessageLite& self) {
  EnumDescriptorProto& this_ = static_cast<EnumDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}